

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O3

char * SetNew(void)

{
  char cVar1;
  char *pcVar2;
  uint uVar3;
  size_t __nmemb;
  
  __nmemb = (size_t)size;
  uVar3 = 1;
  pcVar2 = (char *)calloc(__nmemb,1);
  if (pcVar2 != (char *)0x0) {
    return pcVar2;
  }
  SetNew_cold_1();
  if ((-1 < (int)uVar3) && ((int)uVar3 < size)) {
    cVar1 = *(char *)(__nmemb + uVar3);
    *(undefined1 *)(__nmemb + uVar3) = 1;
    return (char *)(ulong)(cVar1 == '\0');
  }
  __assert_fail("e>=0 && e<size",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/tools/lemon/lemon.c"
                ,0x1299,"int SetAdd(char *, int)");
}

Assistant:

char *SetNew(){
  char *s;
  s = (char*)calloc( size, 1);
  if( s==0 ){
    extern void memory_error();
    memory_error();
  }
  return s;
}